

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_GroundLogisticsVehicle.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::GED_GroundLogisticsVehicle::operator==
          (GED_GroundLogisticsVehicle *this,GED_GroundLogisticsVehicle *Value)

{
  KBOOL KVar1;
  GED_GroundLogisticsVehicle *Value_local;
  GED_GroundLogisticsVehicle *this_local;
  
  if (this->m_ui16EntityID == Value->m_ui16EntityID) {
    if (this->m_i16Offsets[0] == Value->m_i16Offsets[0]) {
      if (this->m_i16Offsets[1] == Value->m_i16Offsets[1]) {
        if (this->m_i16Offsets[2] == Value->m_i16Offsets[2]) {
          KVar1 = DATA_TYPE::EntityAppearance::operator!=(&this->m_EA,&Value->m_EA);
          if (KVar1) {
            this_local._7_1_ = false;
          }
          else if (this->m_i8Ori[0] == Value->m_i8Ori[0]) {
            if (this->m_i8Ori[1] == Value->m_i8Ori[1]) {
              if (this->m_i8Ori[2] == Value->m_i8Ori[2]) {
                if (this->m_i8Spd == Value->m_i8Spd) {
                  this_local._7_1_ = true;
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL GED_GroundLogisticsVehicle::operator == ( const GED_GroundLogisticsVehicle & Value ) const
{
    if( m_ui16EntityID      != Value.m_ui16EntityID )   return false;
    if( m_i16Offsets[0]     != Value.m_i16Offsets[0] )  return false;
    if( m_i16Offsets[1]     != Value.m_i16Offsets[1] )  return false;
    if( m_i16Offsets[2]     != Value.m_i16Offsets[2] )  return false;
    if( m_EA                != Value.m_EA )             return false;
    if( m_i8Ori[0]          != Value.m_i8Ori[0] )       return false;
    if( m_i8Ori[1]          != Value.m_i8Ori[1] )       return false;
    if( m_i8Ori[2]          != Value.m_i8Ori[2] )       return false;
    if( m_i8Spd             != Value.m_i8Spd )          return false;
    return true;
}